

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O3

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey,string *bech32_hrp)

{
  _Rb_tree_header *p_Var1;
  NetType_conflict NVar2;
  CfdSourceLocation local_68;
  TaprootScriptTree *local_50;
  Pubkey *local_48;
  ByteData *local_40;
  string *local_38;
  
  NVar2 = kCfdConnectionError;
  if (bech32_hrp->_M_string_length == 0) {
    NVar2 = type;
  }
  this->type_ = NVar2;
  this->addr_type_ = kTaprootAddress;
  this->witness_ver_ = witness_ver;
  (this->address_)._M_dataplus._M_p = (pointer)&(this->address_).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->address_,"");
  local_38 = &this->address_;
  ByteData::ByteData(&this->hash_);
  local_48 = &this->pubkey_;
  local_40 = &this->hash_;
  Pubkey::Pubkey(local_48);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  local_50 = &this->script_tree_;
  TaprootScriptTree::TaprootScriptTree(local_50,tree);
  Script::Script(&this->redeem_script_);
  p_Var1 = &(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl = 0;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  TapBranch::GetTweakedPubkey
            ((SchnorrPubkey *)&local_68,&tree->super_TapBranch,internal_pubkey,(bool *)0x0);
  ByteData256::operator=(&(this->schnorr_pubkey_).data_,(ByteData256 *)&local_68);
  if (local_68.filename != (char *)0x0) {
    operator_delete(local_68.filename,(long)local_68.funcname - (long)local_68.filename);
  }
  CalculateTaproot(this,bech32_hrp);
  local_68.filename = "cfdcore_address.cpp";
  local_68.line = 0x303;
  local_68.funcname = "Address";
  logger::log<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string_const&>
            (&local_68,kCfdLogLevelInfo,"call Address({},{},{})",&this->type_,&this->addr_type_,
             bech32_hrp);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey, const std::string& bech32_hrp)
    : type_((!bech32_hrp.empty()) ? kCustomChain : type),
      addr_type_(AddressType::kTaprootAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      script_tree_(tree),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  schnorr_pubkey_ = tree.GetTweakedPubkey(internal_pubkey);
  CalculateTaproot(bech32_hrp);
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_, addr_type_, bech32_hrp);
}